

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

void pbrt::PiecewiseConstant1D::TestCompareDistributions
               (PiecewiseConstant1D *da,PiecewiseConstant1D *db,Float eps)

{
  bool bVar1;
  AssertHelper *pAVar2;
  const_reference pvVar3;
  Message *pMVar4;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  AssertionResult gtest_ar_4;
  Float err;
  Float pdfb;
  Float pdfa;
  size_t i;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char (*in_stack_fffffffffffffe58) [4];
  AssertHelper *in_stack_fffffffffffffe60;
  float *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  int iVar9;
  char *in_stack_fffffffffffffe80;
  AssertionResult *this;
  Type in_stack_fffffffffffffe8c;
  AssertHelper *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  undefined1 uVar10;
  AssertHelper *in_stack_fffffffffffffee0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  AssertHelper *this_00;
  AssertHelper *expr1;
  AssertionResult local_c0 [2];
  AssertionResult local_a0 [2];
  size_t local_80;
  size_t local_78;
  AssertionResult local_70;
  uint local_5c;
  size_t local_38;
  size_t local_30;
  AssertionResult local_28;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_10;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RDI);
  local_38 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(local_10);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             (unsigned_long *)in_stack_fffffffffffffe68,(unsigned_long *)in_stack_fffffffffffffe60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe90);
    in_stack_fffffffffffffee0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x53456a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
               (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffee0,
               (Message *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0x5345cd);
  }
  local_5c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x53463b);
  if (local_5c == 0) {
    local_78 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(local_8 + 1);
    local_80 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(local_10 + 1);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               (unsigned_long *)in_stack_fffffffffffffe68,(unsigned_long *)in_stack_fffffffffffffe60
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
    uVar10 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe90);
      testing::AssertionResult::failure_message((AssertionResult *)0x53471b);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
                 (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),in_stack_fffffffffffffe70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffee0,(Message *)CONCAT17(uVar10,in_stack_fffffffffffffed8));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
      testing::Message::~Message((Message *)0x534778);
    }
    local_5c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5347e6);
    if (local_5c == 0) {
      testing::internal::EqHelper<false>::Compare<float,float>
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (float *)in_stack_fffffffffffffe60);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe90);
        testing::AssertionResult::failure_message((AssertionResult *)0x534896);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
                   (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),in_stack_fffffffffffffe70);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffee0,(Message *)CONCAT17(uVar10,in_stack_fffffffffffffed8));
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
        testing::Message::~Message((Message *)0x5348f3);
      }
      local_5c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x534961);
      if (local_5c == 0) {
        testing::internal::EqHelper<false>::Compare<float,float>
                  (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                   (float *)in_stack_fffffffffffffe60);
        iVar9 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe90);
          testing::AssertionResult::failure_message((AssertionResult *)0x534a11);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
                     iVar9,in_stack_fffffffffffffe70);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffee0,(Message *)CONCAT17(uVar10,in_stack_fffffffffffffed8)
                    );
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
          testing::Message::~Message((Message *)0x534a6e);
        }
        local_5c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x534adc);
        if (local_5c == 0) {
          this_00 = (AssertHelper *)0x0;
          while (expr1 = this_00,
                pAVar2 = (AssertHelper *)
                         pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size
                                   (local_8), this_00 < pAVar2) {
            pvVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                               (local_8,(size_type)expr1);
            fVar6 = *pvVar3 / *(float *)&local_8[2].ptr;
            pvVar5 = local_10;
            pvVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                               (local_10,(size_type)expr1);
            fVar7 = *pvVar3 / *(float *)&local_10[2].ptr;
            fVar8 = fVar6 - fVar7;
            std::abs((int)pvVar5);
            this = (AssertionResult *)&stack0xffffffffffffff08;
            testing::internal::CmpHelperLT<float,float>
                      ((char *)expr1,(char *)CONCAT44(fVar6,fVar7),
                       (float *)CONCAT44(fVar8 / ((fVar6 + fVar7) * 0.5),in_stack_ffffffffffffff18),
                       (float *)in_stack_ffffffffffffff10.ptr_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(this);
            in_stack_fffffffffffffe8c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe8c);
            if (!bVar1) {
              testing::Message::Message((Message *)this_00);
              pMVar4 = testing::Message::operator<<
                                 ((Message *)in_stack_fffffffffffffe60,
                                  (float *)in_stack_fffffffffffffe58);
              iVar9 = (int)((ulong)pMVar4 >> 0x20);
              pMVar4 = testing::Message::operator<<
                                 ((Message *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
              testing::Message::operator<<
                        ((Message *)in_stack_fffffffffffffe60,(float *)in_stack_fffffffffffffe58);
              in_stack_fffffffffffffe60 =
                   (AssertHelper *)
                   testing::AssertionResult::failure_message((AssertionResult *)0x534cb8);
              testing::internal::AssertHelper::AssertHelper
                        (this_00,in_stack_fffffffffffffe8c,&this->success_,iVar9,(char *)pMVar4);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffee0,
                         (Message *)CONCAT17(uVar10,in_stack_fffffffffffffed8));
              testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
              testing::Message::~Message((Message *)0x534d12);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x534d67);
            this_00 = (AssertHelper *)
                      ((long)&((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&expr1->data_)->ptr_ + 1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void PiecewiseConstant1D::TestCompareDistributions(const PiecewiseConstant1D &da,
                                                   const PiecewiseConstant1D &db,
                                                   Float eps) {
    ASSERT_EQ(da.func.size(), db.func.size());
    ASSERT_EQ(da.cdf.size(), db.cdf.size());
    ASSERT_EQ(da.min, db.min);
    ASSERT_EQ(da.max, db.max);
    for (size_t i = 0; i < da.func.size(); ++i) {
        Float pdfa = da.func[i] / da.funcInt, pdfb = db.func[i] / db.funcInt;
        Float err = std::abs(pdfa - pdfb) / ((pdfa + pdfb) / 2);
        EXPECT_LT(err, eps) << pdfa << " - " << pdfb;
    }
}